

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O2

void __thiscall
sptk::reaper::FdFilter::FdFilterInitialize
          (FdFilter *this,float input_freq,float corner_freq,bool do_highpass,float filter_dur,
          bool do_rate_conversion,char *spectrum_shape,float *spectrum_array,int n_magnitudes)

{
  int *nf;
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  int16_t *piVar4;
  FILE *pFVar5;
  char *pcVar6;
  float *pfVar7;
  FFT *this_00;
  bool bVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  int iVar13;
  undefined7 in_register_00000031;
  FdFilter *pFVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  float *local_268;
  float local_258;
  int n_spect;
  int local_238;
  undefined4 local_234;
  float fs;
  int ind;
  char line [500];
  
  this->insert_ = 1;
  this->decimate_ = 1;
  this->array_leftover_ = 0;
  this->array_index_ = 0;
  this->array_samples_used_ = 0;
  this->filter_state_ = 1;
  this->true_output_rate_ = input_freq;
  piVar4 = (int16_t *)operator_new__(44000);
  this->output_buffer_ = piVar4;
  piVar4 = (int16_t *)operator_new__(22000);
  this->input_buffer_ = piVar4;
  if (spectrum_shape == (char *)0x0) {
    local_234 = (undefined4)CONCAT71(in_register_00000031,do_highpass);
    bVar12 = 1 < n_magnitudes && spectrum_array != (float *)0x0;
    pFVar5 = (FILE *)0x0;
    if ((1 >= n_magnitudes || spectrum_array == (float *)0x0) && !do_rate_conversion) {
      if (input_freq * 0.5 <= corner_freq) {
        pFVar5 = _stderr;
        fprintf(_stderr,"Unreasonable corner frequency specified to filter() (%f)\n");
      }
      bVar12 = false;
    }
    bVar8 = n_magnitudes < 2 || spectrum_array == (float *)0x0;
    if (n_magnitudes < 2 || spectrum_array == (float *)0x0) {
      local_258 = corner_freq / input_freq;
      if (do_rate_conversion) {
        RationalApproximation((FdFilter *)pFVar5,local_258,&this->insert_,&this->decimate_,0xc);
        uVar18._0_4_ = this->insert_;
        uVar18._4_4_ = this->decimate_;
        fVar20 = (float)(int)(undefined4)uVar18;
        local_258 = fVar20 / (float)(int)uVar18._4_4_;
        if (ABS(1.0 - local_258) < 0.01) {
          fwrite("Input and output frequencies are essentially equal!\n",0x34,1,_stderr);
          uVar9 = this->insert_;
          uVar18 = (ulong)uVar9;
          fVar20 = (float)(int)uVar9;
        }
        local_258 = local_258 * input_freq;
        this->true_output_rate_ = local_258;
        fVar20 = fVar20 * input_freq;
        uVar9 = (int)(filter_dur * fVar20) | 1;
        this->n_filter_coeffs_ = uVar9;
        if (input_freq <= local_258) {
          fVar20 = (float)(int)uVar18;
          local_258 = 0.5;
        }
        else {
          local_258 = local_258 * 0.5;
        }
        local_258 = local_258 / fVar20;
      }
      else {
        uVar9 = (int)(input_freq * filter_dur) | 1;
        this->n_filter_coeffs_ = uVar9;
      }
      nf = &this->n_filter_coeffs_;
      pFVar14 = (FdFilter *)((long)((int)uVar9 / 2) * 4 + 4);
      if ((int)uVar9 < -3) {
        pFVar14 = (FdFilter *)0xffffffffffffffff;
      }
      spectrum_array = (float *)operator_new__((ulong)pFVar14);
      MakeLinearFir(pFVar14,local_258,nf,spectrum_array);
      iVar13 = this->insert_;
      if (iVar13 < 2) {
        iVar3 = *nf;
      }
      else {
        iVar3 = *nf;
        for (uVar18 = (long)iVar3 / 2 & 0xffffffff; -1 < (int)uVar18;
            uVar18 = (ulong)((int)uVar18 - 1)) {
          spectrum_array[uVar18] = spectrum_array[uVar18] * (float)iVar13;
        }
      }
    }
    else {
      iVar3 = n_magnitudes + -1;
      this->n_filter_coeffs_ = iVar3;
      local_238 = 0;
      do {
        local_238 = local_238 + 1;
      } while (1 << ((byte)local_238 & 0x1f) < n_magnitudes * 2 + -2);
    }
    this->n_filter_coeffs_by2_ = iVar3 / 2;
    if (!bVar12) {
      MirrorFilter(this,spectrum_array,local_234._0_1_);
      this->fft_size_ = 0x80;
      iVar13 = 7;
      iVar17 = 0x80;
      while (iVar17 < this->n_filter_coeffs_ * 2) {
        iVar17 = iVar17 * 2;
        this->fft_size_ = iVar17;
        iVar13 = iVar13 + 1;
      }
      bVar12 = false;
      local_268 = spectrum_array;
      goto LAB_0010f6dc;
    }
  }
  else {
    pFVar5 = fopen(spectrum_shape,"r");
    if (pFVar5 == (FILE *)0x0) {
      spectrum_array = (float *)0x0;
      fprintf(_stderr,"Can\'t open %s as a spectrum file\n",spectrum_shape);
    }
    else {
      pcVar6 = fgets(line,500,pFVar5);
      if (pcVar6 == (char *)0x0) {
        spectrum_array = (float *)0x0;
        fprintf(_stderr,"Bad format in spectrum file %s\n",spectrum_shape);
      }
      else {
        iVar3 = __isoc99_sscanf(line,"%d %d %f",&local_238,&n_spect,&fs);
        if ((iVar3 == 3) && ((fs != input_freq || (NAN(fs) || NAN(input_freq))))) {
          fprintf(_stderr,"Filter spec (%f) does not match input frequency (%f)\n",(double)fs,
                  SUB84((double)input_freq,0));
          fwrite("The filtering results will probably not be what you want!\n",0x3a,1,_stderr);
        }
        iVar3 = n_spect;
        uVar18 = (ulong)n_spect;
        pFVar14 = (FdFilter *)(uVar18 * 4);
        if ((long)uVar18 < 0) {
          pFVar14 = (FdFilter *)0xffffffffffffffff;
        }
        spectrum_array = (float *)operator_new__((ulong)pFVar14);
        this->n_filter_coeffs_ = iVar3 + -1;
        pfVar7 = spectrum_array;
        for (lVar11 = 0; lVar11 < (int)uVar18; lVar11 = lVar11 + 1) {
          pcVar6 = fgets(line,500,pFVar5);
          if ((pcVar6 == (char *)0x0) ||
             (iVar3 = __isoc99_sscanf(line,"%d %f",&ind,pfVar7), iVar3 != 2)) {
            fprintf(_stderr,"Parsing error in spect ratio file %s\n",spectrum_shape);
          }
          uVar18 = (ulong)(uint)n_spect;
          pfVar7 = pfVar7 + 1;
        }
      }
      fclose(pFVar5);
    }
    iVar3 = this->n_filter_coeffs_;
    this->n_filter_coeffs_by2_ = iVar3 / 2;
    bVar8 = true;
  }
  iVar17 = iVar3 * 2;
  this->fft_size_ = iVar17;
  iVar13 = 1;
  do {
    iVar13 = iVar13 + 1;
    iVar10 = 1 << ((byte)iVar13 & 0x1f);
  } while (SBORROW4(iVar10,iVar17) != iVar10 + iVar3 * -2 < 0);
  bVar12 = true;
  local_268 = spectrum_array;
LAB_0010f6dc:
  this->fft_size_by2_ = iVar17 >> 1;
  uVar18 = 0xffffffffffffffff;
  uVar15 = (long)iVar17 * 4;
  if (iVar17 < 0) {
    uVar15 = uVar18;
  }
  uVar19 = (long)iVar17 * 2;
  if (iVar17 < 0) {
    uVar19 = uVar18;
  }
  local_238 = iVar13;
  pfVar7 = (float *)operator_new__(uVar15);
  this->x_ = pfVar7;
  pfVar7 = (float *)operator_new__(uVar15);
  this->y_ = pfVar7;
  pfVar7 = (float *)operator_new__(uVar15);
  this->xf_ = pfVar7;
  pfVar7 = (float *)operator_new__(uVar15);
  this->yf_ = pfVar7;
  piVar4 = (int16_t *)operator_new__(uVar19);
  this->leftovers_ = piVar4;
  this->max_input_ = (int)(11000 / (long)this->insert_);
  iVar3 = iVar17 + 22000 + this->n_filter_coeffs_;
  uVar15 = (long)iVar3 * 4;
  if (iVar3 < 0) {
    uVar15 = uVar18;
  }
  pfVar7 = (float *)operator_new__(uVar15);
  this->output_delayed_ = pfVar7;
  this_00 = (FFT *)operator_new(0x20);
  FFT::FFT(this_00,iVar13);
  fVar20 = 1.0 / (float)iVar17;
  this->fft_ = this_00;
  if (bVar12) {
    iVar3 = this->n_filter_coeffs_;
    pfVar7 = this->xf_;
    pfVar1 = this->yf_;
    for (lVar11 = 0; lVar11 <= iVar3; lVar11 = lVar11 + 1) {
      pfVar7[lVar11] = local_268[lVar11] * fVar20;
      pfVar1[lVar11] = 0.0;
    }
    iVar3 = this->fft_size_;
    pfVar7 = this->xf_;
    pfVar1 = this->yf_;
    lVar16 = iVar3 - lVar11;
    for (; lVar11 < iVar3; lVar11 = lVar11 + 1) {
      pfVar7[lVar11] = pfVar7[lVar16];
      pfVar1[lVar11] = 0.0;
      lVar16 = lVar16 + -1;
    }
  }
  else {
    uVar9 = this->n_filter_coeffs_by2_;
    lVar11 = (long)(int)uVar9;
    pfVar7 = this->xf_;
    pfVar1 = this->yf_;
    pfVar2 = this->filter_coeffs_;
    for (lVar16 = 0; lVar16 <= lVar11; lVar16 = lVar16 + 1) {
      pfVar7[lVar16] = pfVar2[lVar11 + lVar16] * fVar20;
      pfVar1[lVar16] = 0.0;
    }
    iVar3 = this->n_filter_coeffs_;
    pfVar7 = this->filter_coeffs_;
    pfVar1 = this->xf_;
    iVar13 = this->fft_size_;
    pfVar2 = this->yf_;
    for (; lVar16 < iVar3; lVar16 = lVar16 + 1) {
      iVar17 = (iVar13 - iVar3) + (int)lVar16;
      pfVar1[iVar17] = pfVar7[(int)(~uVar9 + (int)lVar16)] * fVar20;
      pfVar2[iVar17] = 0.0;
    }
    lVar16 = this->fft_size_ - lVar11;
    pfVar7 = this->xf_;
    pfVar1 = this->yf_;
    for (; lVar11 < lVar16; lVar11 = lVar11 + 1) {
      pfVar1[lVar11] = 0.0;
      pfVar7[lVar11] = 0.0;
    }
    FFT::fft(this_00,this->xf_,this->yf_);
  }
  if (bVar8 && local_268 != (float *)0x0) {
    operator_delete__(local_268);
  }
  return;
}

Assistant:

void FdFilter::FdFilterInitialize(float input_freq, float corner_freq,
                                  bool do_highpass, float filter_dur,
                                  bool do_rate_conversion,
                                  char *spectrum_shape, float *spectrum_array,
                                  int n_magnitudes) {
  float beta = 0.0, *b = NULL;
  float  ratio_t, ratio, freq1 = input_freq;
  int pow2, i;
  bool do_eq_filtering = false;
  bool b_allocated = true;

  insert_ = 1;
  decimate_ = 1;
  filter_state_ = 1;
  array_leftover_ = 0;
  array_index_ = 0;
  array_samples_used_ = 0;
  true_output_rate_ = input_freq;

  output_buffer_ = new int16_t[kIoBufferSize * 2];
  input_buffer_ = new int16_t[kIoBufferSize];

  if (spectrum_shape || (spectrum_array && (n_magnitudes > 1))) {
    do_eq_filtering = true;
  } else {
    if (do_rate_conversion) {
      freq1 = input_freq;
    } else {   /* it is just a symmetric FIR */
      if (corner_freq >= (freq1 = input_freq) / 2.0) {
        fprintf(stderr,
                "Unreasonable corner frequency specified to filter() (%f)\n",
                corner_freq);
      }
    }
  }

  if (spectrum_shape) {
    FILE *spec_stream = fopen(spectrum_shape, "r");
    if (spec_stream) {
      int n_spect, ind;
      char line[500];
      float fs;
      if (fgets(line, 500, spec_stream)) {
        int nItems = sscanf(line, "%d %d %f", &pow2, &n_spect, &fs);
        if ((nItems == 3) && (fs != input_freq)) {  // This should be a
                                                  // fatal error!
          fprintf(stderr,
                  "Filter spec (%f) does not match input frequency (%f)\n",
                  fs, input_freq);
          fprintf(stderr,
               "The filtering results will probably not be what you want!\n");
        }
        b = new float[n_spect];
        n_filter_coeffs_ = n_spect - 1;  // n_filter_coeffs_ represents actual
                                         // filter-kernel length,
                                         // instead of half filter
                                         // length when using external
                                         // filter.
        for (i = 0; i < n_spect; i++) {
          if ((!fgets(line, 500, spec_stream)) ||
             (sscanf(line, "%d %f", &ind, &(b[i])) != 2)) {
            fprintf(stderr, "Parsing error in spect ratio file %s\n",
                    spectrum_shape);
          }
        }
      } else {
        fprintf(stderr, "Bad format in spectrum file %s\n",
                             spectrum_shape);
      }
      fclose(spec_stream);
    } else {
      fprintf(stderr, "Can't open %s as a spectrum file\n",
                           spectrum_shape);
    }
  } else {
    // Note: n_magnitudes MUST be ((2^k)+1) for k > 1.
    if (spectrum_array && (n_magnitudes > 1)) {
      n_filter_coeffs_ = n_magnitudes - 1;
      int nft = n_filter_coeffs_ * 2;
      pow2 = 1;
      while ((1 << pow2) < nft) {
        pow2++;
      }
      b = spectrum_array;  // Note: b must not be deleted in this case!
      b_allocated = false;
    } else { /* it is not an eq filter */
      if (do_rate_conversion) {
        /* get a ratio of integers close to desired freq. ratio. */
        ratio = corner_freq/freq1;
        RationalApproximation(ratio, &insert_, &decimate_, kMaxDecimation);
        ratio_t = static_cast<float>(insert_) / decimate_;

        if (fabs(1.0 - ratio_t) < .01) {
          fprintf(stderr,
                  "Input and output frequencies are essentially equal!\n");
        }
        true_output_rate_ = ratio_t * freq1;
        // if (corner_freq != true_output_rate_) {
        //   fprintf(stderr,
        // "Warning: Output frequency obtained(%f) is not as requested(%f)\n",
        //    true_output_rate_, corner_freq);
        // }
        corner_freq = true_output_rate_;
        n_filter_coeffs_ = static_cast<int>(freq1 * insert_ * filter_dur) | 1;
        if (corner_freq < freq1)
          beta = (.5 * corner_freq)/(insert_ * freq1);
        else
          beta = .5/insert_;
      } else {
        beta = corner_freq/freq1;
        n_filter_coeffs_ = static_cast<int>(freq1 * filter_dur) | 1;
      }

      /* Generate the symmetric FIR filter coefficients. */
      b = new float[1 + (n_filter_coeffs_ / 2)];
      MakeLinearFir(beta, &n_filter_coeffs_, b);

      if (insert_ > 1) {  // Scale up filter coeffs. to maintain
                        // precision in output.
        float fact = insert_;
        for (i = n_filter_coeffs_ / 2; i >= 0; i--) b[i] *= fact;
      }
    }  // end else it is not an eq filter.
  }  // end else (a spectrum shape was not specified).

  n_filter_coeffs_by2_ = n_filter_coeffs_ / 2;

  if (!do_eq_filtering) { /* Is it a simple high- or low-pass filter? */
    MirrorFilter(b, do_highpass);
    int nf2 = n_filter_coeffs_ << 1;
    fft_size_ = 128;
    pow2 = 7;
    while (nf2 > fft_size_) {
      fft_size_ *= 2;
      pow2++;
    }
  } else {  // It is a filter with the magnitude response specified in b.
    fft_size_ = n_filter_coeffs_ * 2;
    pow2 = 2;
    while ((1 << pow2) < fft_size_)
      pow2++;
  }

  fft_size_by2_ = fft_size_ / 2;

  x_ = new float[fft_size_];
  y_ = new float[fft_size_];
  xf_ = new float[fft_size_];
  yf_ = new float[fft_size_];

  leftovers_ = new int16_t[fft_size_];
  max_input_ = kIoBufferSize / insert_;
  output_delayed_ = new float[(2 * kIoBufferSize)+n_filter_coeffs_+fft_size_];

  float ftscale = 1.0 / fft_size_;
  fft_ = new FFT(pow2);
  if (!do_eq_filtering) {
    // position the filter kernel to be symmetric about time=0
    // Note that this assumes an odd number of symmetric filter coefficients.
    for (i = 0; i <= n_filter_coeffs_by2_; i++) {
      xf_[i] = ftscale * filter_coeffs_[i+n_filter_coeffs_by2_];
      yf_[i] = 0.0;
    }
    for (; i < n_filter_coeffs_; i++) {
      xf_[fft_size_ - n_filter_coeffs_ + i] = ftscale *
           filter_coeffs_[i - n_filter_coeffs_by2_ - 1];
      yf_[fft_size_ - n_filter_coeffs_ + i] = 0.0;
    }
    for (i = n_filter_coeffs_by2_; i < (fft_size_-n_filter_coeffs_by2_); i++)
      xf_[i] = yf_[i] = 0.0;
    fft_->fft(xf_, yf_);
  } else { /* Install the magnitude response symmetrically. */
    for (i = 0; i <= n_filter_coeffs_; i++) {
      xf_[i] = ftscale * b[i];
      yf_[i] = 0.0;
    }
    for (; i < fft_size_; i++) {
      xf_[i] = xf_[fft_size_ - i];
      yf_[i] = 0.0;
    }
  }
  /* The filter, regardless of its origin, is now in the frequency domain. */

  if (b_allocated) {
    delete [] b;
  }
}